

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void __thiscall ExecutorX86::ClearNative(ExecutorX86 *this)

{
  ExpiredCodeBlock *pEVar1;
  long lVar2;
  int iVar3;
  void *__addr;
  ulong uVar4;
  long lVar5;
  TraceScope traceScope;
  TraceScope local_40;
  
  if (ClearNative()::token == '\0') {
    iVar3 = __cxa_guard_acquire(&ClearNative()::token);
    if (iVar3 != 0) {
      ClearNative::token = NULLC::TraceGetToken("x86","ClearNative");
      __cxa_guard_release(&ClearNative()::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_40,ClearNative::token);
  uVar4 = (ulong)(this->instList).count;
  if (uVar4 != 0) {
    NULLC::fillMemory((this->instList).data,0,uVar4 * 0x50);
  }
  *(undefined8 *)&(this->instList).count = 0;
  this->binCodeSize = 0;
  (this->globalCodeRanges).count = 0;
  if ((this->expiredCodeBlocks).count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      pEVar1 = (this->expiredCodeBlocks).data;
      lVar2 = *(long *)((long)&pEVar1->code + lVar5);
      __addr = (void *)((lVar2 + 0xfffU & 0xfffffffffffff000) - 0x1000);
      mprotect(__addr,(lVar2 + (ulong)*(uint *)((long)&pEVar1->codeSize + lVar5) + 0xfff &
                      0xfffffffffffff000) - (long)__addr,3);
      (*(code *)NULLC::dealloc)(*(undefined8 *)((long)&pEVar1->code + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    } while (uVar4 < (this->expiredCodeBlocks).count);
  }
  (this->expiredCodeBlocks).count = 0;
  if ((this->expiredFunctionAddressLists).count != 0) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      (*(code *)NULLC::dealloc)
                (*(undefined8 *)((long)&((this->expiredFunctionAddressLists).data)->data + lVar5));
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar4 < (this->expiredFunctionAddressLists).count);
  }
  (this->expiredFunctionAddressLists).count = 0;
  this->oldJumpTargetCount = 0;
  this->oldRegKillInfoCount = 0;
  this->oldFunctionSize = 0;
  if (this->codeGenCtx != (CodeGenRegVmContext *)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  this->codeGenCtx = (CodeGenRegVmContext *)0x0;
  this->codeRunning = false;
  NULLC::TraceScope::~TraceScope(&local_40);
  return;
}

Assistant:

void ExecutorX86::ClearNative()
{
	TRACE_SCOPE("x86", "ClearNative");

	if (instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();

	binCodeSize = 0;
	lastInstructionCount = 0;

	globalCodeRanges.clear();

	for(unsigned i = 0; i < expiredCodeBlocks.size(); i++)
	{
		ExpiredCodeBlock &block = expiredCodeBlocks[i];

#ifndef __linux
		DWORD unusedProtect;
		VirtualProtect((void*)block.code, block.codeSize, oldCodeBodyProtect, &unusedProtect);
#else
		NULLC::MemProtect((void*)block.code, block.codeSize, PROT_READ | PROT_WRITE);
#endif

		NULLC::dealloc(block.code);

#if defined(_M_X64) && !defined(__linux)
		if(block.unwindTable)
		{
			RtlDeleteFunctionTable(block.unwindTable);
			NULLC::dealloc(block.unwindTable);
		}
#endif
	}

	expiredCodeBlocks.clear();

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		NULLC::dealloc(info.data);
	}
	expiredFunctionAddressLists.clear();

#if defined(_M_X64) && !defined(__linux)
	// Remove function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();
#endif

	oldJumpTargetCount = 0;
	oldRegKillInfoCount = 0;
	oldFunctionSize = 0;

	// Create new code generation context
	if(codeGenCtx)
		NULLC::destruct(codeGenCtx);
	codeGenCtx = NULL;

	codeRunning = false;
}